

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bblif.c
# Opt level: O2

Bbl_Man_t * Bbl_ManReadBinaryBlif(char *pFileName)

{
  int iVar1;
  int iVar2;
  Bbl_Man_t *pBVar3;
  char *pcVar4;
  Vec_Str_t *pVVar5;
  Vec_Str_t *pVVar6;
  Vec_Int_t *p;
  int nCapMin;
  uint uVar7;
  char *pBuffer;
  
  pBVar3 = (Bbl_Man_t *)calloc(1,0x4d0);
  iVar1 = Bbl_ManFileSize(pFileName);
  pBVar3->nFileSize = iVar1;
  pcVar4 = Bbl_ManFileRead(pFileName);
  pBVar3->pFileData = pcVar4;
  pBuffer = pcVar4;
  pVVar5 = Vec_StrRead(&pBuffer);
  pBVar3->pName = pVVar5;
  pVVar5 = Vec_StrRead(&pBuffer);
  pBVar3->pObjs = pVVar5;
  pVVar6 = Vec_StrRead(&pBuffer);
  pBVar3->pFncs = pVVar6;
  if ((long)pBuffer - (long)pcVar4 == (long)iVar1) {
    p = Vec_IntAlloc(1000);
    pBVar3->vObj2Id = p;
    uVar7 = 0;
    while (((int)uVar7 < pVVar5->nSize && (pcVar4 = pVVar5->pArray, pcVar4 != (char *)0x0))) {
      iVar1 = *(int *)(pcVar4 + uVar7);
      iVar2 = p->nSize;
      if (iVar2 == p->nCap) {
        nCapMin = iVar2 * 2;
        if (iVar2 < 0x10) {
          nCapMin = 0x10;
        }
        Vec_IntGrow(p,nCapMin);
        iVar2 = p->nSize;
      }
      p->nSize = iVar2 + 1;
      p->pArray[iVar2] = iVar1;
      *(int *)(pcVar4 + uVar7) = p->nSize + -1;
      uVar7 = uVar7 + (*(uint *)(pcVar4 + (ulong)uVar7 + 8) >> 4) * 4 + 0xc;
    }
    return pBVar3;
  }
  __assert_fail("pBuffer - p->pFileData == p->nFileSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/bbl/bblif.c"
                ,0x2d7,"Bbl_Man_t *Bbl_ManReadBinaryBlif(char *)");
}

Assistant:

Bbl_Man_t * Bbl_ManReadBinaryBlif( char * pFileName )
{
    Bbl_Man_t * p;
    Bbl_Obj_t * pObj;
    char * pBuffer;
    int h;
    p = BBLIF_ALLOC( Bbl_Man_t, 1 );
    memset( p, 0, sizeof(Bbl_Man_t) );
    p->nFileSize = Bbl_ManFileSize( pFileName );
    p->pFileData = Bbl_ManFileRead( pFileName );
    // extract three managers
    pBuffer = p->pFileData;
    p->pName = Vec_StrRead( &pBuffer );
    p->pObjs = Vec_StrRead( &pBuffer );
    p->pFncs = Vec_StrRead( &pBuffer );
    assert( pBuffer - p->pFileData == p->nFileSize );
    // remember original IDs in the objects
    p->vObj2Id = Vec_IntAlloc( 1000 );
    Bbl_ManForEachObj_int( p->pObjs, pObj, h )
    {
        Vec_IntPush( p->vObj2Id, pObj->Id );
        pObj->Id = Vec_IntSize(p->vObj2Id) - 1; 
    }
    return p;
}